

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

DebuggerScope * __thiscall
Js::FunctionBody::RecordStartScopeObject
          (FunctionBody *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation,
          int *index)

{
  Type index_00;
  Recycler *this_00;
  bool bVar1;
  Recycler *alloc;
  ScopeObjectChain *this_01;
  undefined1 auVar2 [8];
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if ((this->m_sourceInfo).pScopeObjectChain.ptr == (ScopeObjectChain *)0x0) {
    this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
    local_70 = (undefined1  [8])&ScopeObjectChain::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data._32_8_ = &(this->m_sourceInfo).pScopeObjectChain;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x1ed0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_70);
    this_01 = (ScopeObjectChain *)new<Memory::Recycler>(8,alloc,0x37a1d4);
    ScopeObjectChain::ScopeObjectChain(this_01,this_00);
    Memory::WriteBarrierPtr<Js::ScopeObjectChain>::WriteBarrierSet
              ((WriteBarrierPtr<Js::ScopeObjectChain> *)data._32_8_,this_01);
  }
  local_70 = (undefined1  [8])0x0;
  index_00 = this->debuggerScopeIndex;
  this->debuggerScopeIndex = index_00 + 1;
  bVar1 = TryGetDebuggerScopeAt(this,index_00,(DebuggerScope **)local_70);
  auVar2 = local_70;
  if (bVar1) {
    DebuggerScope::UpdateDueToByteCodeRegeneration
              ((DebuggerScope *)local_70,scopeType,start,scopeLocation);
  }
  else {
    auVar2 = (undefined1  [8])AddScopeObject(this,scopeType,start,scopeLocation);
  }
  if (index != (int *)0x0) {
    *index = index_00;
  }
  return (DebuggerScope *)auVar2;
}

Assistant:

DebuggerScope* FunctionBody::RecordStartScopeObject(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation, int* index)
    {
        Recycler* recycler = m_scriptContext->GetRecycler();

        if (!GetScopeObjectChain())
        {
            SetScopeObjectChain(RecyclerNew(recycler, ScopeObjectChain, recycler));
        }

        // Check if we need to create the scope object or if it already exists from a previous bytecode
        // generator pass.
        DebuggerScope* debuggerScope = nullptr;
        int currentDebuggerScopeIndex = this->GetNextDebuggerScopeIndex();
        if (!this->TryGetDebuggerScopeAt(currentDebuggerScopeIndex, debuggerScope))
        {
            // Create a new debugger scope.
            debuggerScope = AddScopeObject(scopeType, start, scopeLocation);
        }
        else
        {
            debuggerScope->UpdateDueToByteCodeRegeneration(scopeType, start, scopeLocation);
        }

        if(index)
        {
            *index = currentDebuggerScopeIndex;
        }

        return debuggerScope;
    }